

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Event *this;
  Event *this_00;
  Event *this_01;
  KeyEventHandle *this_02;
  Handle *this_03;
  
  this = (Event *)operator_new(0x10);
  Event::Event(this,TYPE_KEY);
  this_00 = (Event *)operator_new(0x10);
  Event::Event(this_00,TYPE_TOUCH);
  this_01 = (Event *)operator_new(0x10);
  Event::Event(this_01,TYPE_UNKNOWN);
  this_02 = (KeyEventHandle *)operator_new(0x10);
  KeyEventHandle::KeyEventHandle(this_02);
  this_03 = (Handle *)operator_new(0x10);
  TouchEventHandle::TouchEventHandle((TouchEventHandle *)this_03);
  (this_02->super_EventHandle).super_Handle._successor = this_03;
  puts("case keyHandle:");
  (*(this_02->super_EventHandle).super_Handle._vptr_Handle[2])(this_02,this);
  (*(this_02->super_EventHandle).super_Handle._vptr_Handle[2])(this_02,this_00);
  (*(this_02->super_EventHandle).super_Handle._vptr_Handle[2])(this_02,this_01);
  puts("case touchHandle:");
  (*this_03->_vptr_Handle[2])(this_03,this);
  (*this_03->_vptr_Handle[2])(this_03,this_00);
  (*this_03->_vptr_Handle[2])(this_03,this_01);
  (*this->_vptr_Event[1])(this);
  (*this_00->_vptr_Event[1])(this_00);
  (*this_01->_vptr_Event[1])(this_01);
  (*(this_02->super_EventHandle).super_Handle._vptr_Handle[1])(this_02);
  (*this_03->_vptr_Handle[1])(this_03);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Event* ekey = new Event(Event::TYPE_KEY);
	Event* etouch = new Event(Event::TYPE_TOUCH);
	Event* eunknown = new Event();

	EventHandle* keyHandle = new KeyEventHandle();
	EventHandle* touchHandle = new TouchEventHandle();

	keyHandle->setSuccessor(touchHandle);


	printf("case keyHandle:\n");
	keyHandle->onHandleEvent(ekey);
	keyHandle->onHandleEvent(etouch);
	keyHandle->onHandleEvent(eunknown);

	printf("case touchHandle:\n");
	touchHandle->onHandleEvent(ekey);
	touchHandle->onHandleEvent(etouch);
	touchHandle->onHandleEvent(eunknown);

	delete ekey;
	delete etouch;
	delete eunknown;

	delete keyHandle;
	delete touchHandle;

	return 0;
}